

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pp.cpp
# Opt level: O2

int __thiscall
glslang::TPpContext::eval
          (TPpContext *this,int token,int precedence,bool shortCircuit,int *res,bool *err,
          TPpToken *ppToken)

{
  int iVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  MacroSymbol *pMVar7;
  char *pcVar8;
  TParseContextBase *pTVar9;
  EShMessages EVar10;
  _func_int **pp_Var11;
  ulong uVar12;
  long lVar13;
  TSourceLoc loc;
  
  while( true ) {
    loc.column = (ppToken->loc).column;
    loc._20_4_ = *(undefined4 *)&(ppToken->loc).field_0x14;
    loc.name._0_4_ = *(undefined4 *)&(ppToken->loc).name;
    loc.name._4_4_ = *(undefined4 *)((long)&(ppToken->loc).name + 4);
    loc.string = (ppToken->loc).string;
    loc.line = (ppToken->loc).line;
    if (token == 0x28) break;
    if (token == 0x98) {
      *res = (ppToken->field_3).ival;
      goto LAB_003bbf2e;
    }
    if (token != 0xa2) {
      uVar5 = 3;
      goto LAB_003bbf4a;
    }
    iVar4 = strcmp("defined",ppToken->name);
    if (iVar4 == 0) {
      if ((((this->parseContext->super_TParseVersions).messages & EShMsgReadHlsl) == EShMsgDefault)
         && (bVar3 = isMacroInput(this), bVar3)) {
        pTVar9 = this->parseContext;
        EVar10 = (pTVar9->super_TParseVersions).messages & EShMsgRelaxedErrors;
        pcVar8 = "nonportable when expanded from macros for preprocessor expression";
        if (EVar10 == EShMsgDefault) {
          pcVar8 = "cannot use in preprocessor expression when expanded from macros";
        }
        (*(pTVar9->super_TParseVersions)._vptr_TParseVersions[(ulong)EVar10 + 0x2f])
                  (pTVar9,ppToken,pcVar8,"defined","");
      }
      iVar6 = scanToken(this,ppToken);
      iVar4 = iVar6;
      if (iVar6 == 0x28) {
        iVar4 = scanToken(this,ppToken);
      }
      if (iVar4 != 0xa2) {
        (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                  (this->parseContext,&loc,"incorrect directive, expected identifier",
                   "preprocessor evaluation","");
        *err = true;
        *res = 0;
        return iVar4;
      }
      iVar4 = TStringAtomMap::getAtom(&this->atomStrings,ppToken->name);
      pMVar7 = lookupMacroDef(this,iVar4);
      uVar5 = 0;
      if (pMVar7 != (MacroSymbol *)0x0) {
        uVar5 = (uint)((pMVar7->field_0x48 & 4) == 0);
      }
      *res = uVar5;
      token = scanToken(this,ppToken);
      if (iVar6 == 0x28) goto LAB_003bbf25;
      goto LAB_003bbfa3;
    }
    iVar4 = tokenPaste(this,0xa2,ppToken);
    token = evalToToken(this,iVar4,shortCircuit,res,err,ppToken);
  }
  iVar4 = scanToken(this,ppToken);
  token = eval(this,iVar4,0,shortCircuit,res,err,ppToken);
  if (*err == false) {
LAB_003bbf25:
    if (token != 0x29) {
      pTVar9 = this->parseContext;
      pp_Var11 = (pTVar9->super_TParseVersions)._vptr_TParseVersions;
      pcVar8 = "expected \')\'";
LAB_003bc206:
      (*pp_Var11[0x2f])(pTVar9,&loc,pcVar8,"preprocessor evaluation","");
      *err = true;
      *res = 0;
      return token;
    }
LAB_003bbf2e:
    token = scanToken(this,ppToken);
  }
LAB_003bbfa3:
  iVar4 = evalToToken(this,token,shortCircuit,res,err,ppToken);
  while( true ) {
    uVar5 = 0x11;
    if (((*err != false) || (iVar4 == 10)) || (iVar4 == 0x29)) {
      return iVar4;
    }
    do {
      if ((int)uVar5 < 0) {
        return iVar4;
      }
      lVar13 = (ulong)uVar5 * 0x10;
      uVar5 = uVar5 - 1;
    } while (*(int *)((anonymous_namespace)::binop + lVar13) != iVar4);
    iVar6 = *(int *)((anonymous_namespace)::binop + lVar13 + 4);
    if (iVar6 <= precedence) break;
    iVar1 = *res;
    if (((shortCircuit & 1U) == 0) &&
       ((iVar1 == 1 && iVar4 == 0x8e || (iVar4 == 0x8d && iVar1 == 0)))) {
      shortCircuit = true;
    }
    iVar4 = scanToken(this,ppToken);
    iVar4 = eval(this,iVar4,iVar6,(bool)(shortCircuit & 1),res,err,ppToken);
    pcVar2 = *(code **)((anonymous_namespace)::binop + lVar13 + 8);
    iVar6 = *res;
    if (iVar6 == 0 && (pcVar2 == anon_unknown_6::op_mod || pcVar2 == anon_unknown_6::op_div)) {
      (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                (this->parseContext,&loc,"division by 0","preprocessor evaluation","");
      *res = 1;
      iVar6 = 1;
    }
    iVar6 = (*pcVar2)(iVar1,iVar6);
    *res = iVar6;
  }
  return iVar4;
  while( true ) {
    uVar12 = (ulong)uVar5;
    uVar5 = uVar5 - 1;
    if (*(int *)((anonymous_namespace)::unop + uVar12 * 0x10) == token) break;
LAB_003bbf4a:
    if ((int)uVar5 < 0) {
      pTVar9 = this->parseContext;
      pp_Var11 = (pTVar9->super_TParseVersions)._vptr_TParseVersions;
      pcVar8 = "bad expression";
      goto LAB_003bc206;
    }
  }
  iVar4 = scanToken(this,ppToken);
  token = eval(this,iVar4,0xc,shortCircuit,res,err,ppToken);
  iVar4 = (**(code **)((anonymous_namespace)::unop + uVar12 * 0x10 + 8))(*res);
  *res = iVar4;
  goto LAB_003bbfa3;
}

Assistant:

int TPpContext::eval(int token, int precedence, bool shortCircuit, int& res, bool& err, TPpToken* ppToken)
{
    TSourceLoc loc = ppToken->loc;  // because we sometimes read the newline before reporting the error
    if (token == PpAtomIdentifier) {
        if (strcmp("defined", ppToken->name) == 0) {
            if (! parseContext.isReadingHLSL() && isMacroInput()) {
                if (parseContext.relaxedErrors())
                    parseContext.ppWarn(ppToken->loc, "nonportable when expanded from macros for preprocessor expression",
                        "defined", "");
                else
                    parseContext.ppError(ppToken->loc, "cannot use in preprocessor expression when expanded from macros",
                        "defined", "");
            }
            bool needclose = 0;
            token = scanToken(ppToken);
            if (token == '(') {
                needclose = true;
                token = scanToken(ppToken);
            }
            if (token != PpAtomIdentifier) {
                parseContext.ppError(loc, "incorrect directive, expected identifier", "preprocessor evaluation", "");
                err = true;
                res = 0;

                return token;
            }

            MacroSymbol* macro = lookupMacroDef(atomStrings.getAtom(ppToken->name));
            res = macro != nullptr ? !macro->undef : 0;
            token = scanToken(ppToken);
            if (needclose) {
                if (token != ')') {
                    parseContext.ppError(loc, "expected ')'", "preprocessor evaluation", "");
                    err = true;
                    res = 0;

                    return token;
                }
                token = scanToken(ppToken);
            }
        } else {
            token = tokenPaste(token, *ppToken);
            token = evalToToken(token, shortCircuit, res, err, ppToken);
            return eval(token, precedence, shortCircuit, res, err, ppToken);
        }
    } else if (token == PpAtomConstInt) {
        res = ppToken->ival;
        token = scanToken(ppToken);
    } else if (token == '(') {
        token = scanToken(ppToken);
        token = eval(token, MIN_PRECEDENCE, shortCircuit, res, err, ppToken);
        if (! err) {
            if (token != ')') {
                parseContext.ppError(loc, "expected ')'", "preprocessor evaluation", "");
                err = true;
                res = 0;

                return token;
            }
            token = scanToken(ppToken);
        }
    } else {
        int op = NUM_ELEMENTS(unop) - 1;
        for (; op >= 0; op--) {
            if (unop[op].token == token)
                break;
        }
        if (op >= 0) {
            token = scanToken(ppToken);
            token = eval(token, UNARY, shortCircuit, res, err, ppToken);
            res = unop[op].op(res);
        } else {
            parseContext.ppError(loc, "bad expression", "preprocessor evaluation", "");
            err = true;
            res = 0;

            return token;
        }
    }

    token = evalToToken(token, shortCircuit, res, err, ppToken);

    // Perform evaluation of binary operation, if there is one, otherwise we are done.
    while (! err) {
        if (token == ')' || token == '\n')
            break;
        int op;
        for (op = NUM_ELEMENTS(binop) - 1; op >= 0; op--) {
            if (binop[op].token == token)
                break;
        }
        if (op < 0 || binop[op].precedence <= precedence)
            break;
        int leftSide = res;

        // Setup short-circuiting, needed for ES, unless already in a short circuit.
        // (Once in a short-circuit, can't turn off again, until that whole subexpression is done.
        if (! shortCircuit) {
            if ((token == PpAtomOr  && leftSide == 1) ||
                (token == PpAtomAnd && leftSide == 0))
                shortCircuit = true;
        }

        token = scanToken(ppToken);
        token = eval(token, binop[op].precedence, shortCircuit, res, err, ppToken);

        if (binop[op].op == op_div || binop[op].op == op_mod) {
            if (res == 0) {
                parseContext.ppError(loc, "division by 0", "preprocessor evaluation", "");
                res = 1;
            }
        }
        res = binop[op].op(leftSide, res);
    }

    return token;
}